

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommylist.h
# Opt level: O2

void * tommy_list_remove_existing(tommy_list *list,tommy_node *node)

{
  void *pvVar1;
  tommy_node *ptVar2;
  tommy_node_struct *ptVar3;
  tommy_node_struct *ptVar4;
  tommy_node_struct *ptVar5;
  long in_FS_OFFSET;
  
  pvVar1 = *(void **)(in_FS_OFFSET + 0x28);
  ptVar2 = *list;
  ptVar3 = node->next;
  ptVar4 = node->prev;
  ptVar5 = ptVar3;
  if (ptVar3 == (tommy_node_struct *)0x0) {
    ptVar5 = ptVar2;
  }
  ptVar5->prev = ptVar4;
  if (ptVar2 == node) {
    ptVar4 = (tommy_node_struct *)list;
  }
  ptVar4->next = ptVar3;
  if (*(void **)(in_FS_OFFSET + 0x28) == pvVar1) {
    return pvVar1;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline void* tommy_list_remove_existing(tommy_list* list, tommy_node* node)
{
	tommy_node* head = tommy_list_head(list);

	/* remove from the "circular" prev list */
	if (node->next)
		node->next->prev = node->prev;
	else
		head->prev = node->prev; /* the last */

	/* remove from the "0 terminated" next list */
	if (head == node)
		*list = node->next; /* the new head, in case 0 */
	else
		node->prev->next = node->next;

	return node->data;
}